

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_test.cc
# Opt level: O3

void intgemm::kernel_write_test<(intgemm::CPUType)3,double>(void)

{
  long lVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  AlignedVector<double> output;
  AlignedVector<double> input;
  AssertionHandler catchAssertionHandler;
  AlignedVector<double> local_f0;
  AlignedVector<double> local_e0;
  SourceLineInfo local_d0;
  double local_c0;
  ITransientExpression local_b8;
  long local_a8;
  char *local_a0;
  size_t sStack_98;
  double *local_90;
  StringRef local_88;
  AssertionHandler local_78;
  
  if (2 < kCPU) {
    AlignedVector<double>::AlignedVector(&local_e0,4,0x40);
    AlignedVector<double>::AlignedVector(&local_f0,4,0x40);
    if (local_e0.size_ != 0) {
      dVar7 = 0.0;
      lVar5 = 0;
      do {
        *(double *)((long)local_e0.mem_ + lVar5) = dVar7;
        dVar7 = dVar7 + 1.0;
        lVar5 = lVar5 + 8;
      } while (local_e0.size_ << 3 != lVar5);
    }
    dVar7 = local_e0.mem_[1];
    dVar3 = local_e0.mem_[2];
    dVar4 = local_e0.mem_[3];
    *local_f0.mem_ = *local_e0.mem_;
    local_f0.mem_[1] = dVar7;
    local_f0.mem_[2] = dVar3;
    local_f0.mem_[3] = dVar4;
    lVar5 = 0;
    lVar6 = 0;
    do {
      local_b8._vptr_ITransientExpression = (_func_int **)0x1b2b11;
      local_b8.m_isBinaryExpression = true;
      local_b8.m_result = false;
      local_b8._10_6_ = 0;
      local_d0.file =
           "/workspace/llm4binary/github/license_c_cmakelists/kpu[P]intgemm/test/kernels/write_test.cc"
      ;
      local_d0.line = 0x1c;
      Catch::StringRef::StringRef(&local_88,"output[i] == ElemType_(i)");
      Catch::AssertionHandler::AssertionHandler
                (&local_78,(StringRef *)&local_b8,&local_d0,local_88,ContinueOnFailure);
      local_c0 = (double)lVar6;
      bVar2 = local_c0 == *(double *)((long)local_f0.mem_ + lVar5);
      lVar1 = (long)local_f0.mem_ + lVar5;
      Catch::StringRef::StringRef((StringRef *)&local_d0,"==");
      local_b8.m_result = bVar2;
      local_b8.m_isBinaryExpression = true;
      local_b8._vptr_ITransientExpression =
           (_func_int **)&PTR_streamReconstructedExpression_001ebad8;
      local_a0 = local_d0.file;
      sStack_98 = local_d0.line;
      local_90 = &local_c0;
      local_a8 = lVar1;
      Catch::AssertionHandler::handleExpr(&local_78,&local_b8);
      Catch::ITransientExpression::~ITransientExpression(&local_b8);
      Catch::AssertionHandler::complete(&local_78);
      if (local_78.m_completed == false) {
        (*(local_78.m_resultCapture)->_vptr_IResultCapture[0xe])(local_78.m_resultCapture,&local_78)
        ;
      }
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 8;
    } while (lVar6 != 4);
    free(local_f0.mem_);
    free(local_e0.mem_);
  }
  return;
}

Assistant:

void kernel_write_test() {
  if (kCPU < CPUType_)
    return;

  using vec_t = vector_t<CPUType_, ElemType_>;
  constexpr static std::size_t VECTOR_LENGTH = sizeof(vec_t) / sizeof(ElemType_);

  AlignedVector<ElemType_> input(VECTOR_LENGTH);
  AlignedVector<ElemType_> output(VECTOR_LENGTH);

  std::iota(input.begin(), input.end(), static_cast<ElemType_>(0));

  kernels::write(*input.template as<vec_t>(), output.begin(), 0);
  for (std::size_t i = 0; i < VECTOR_LENGTH; ++i)
#if !defined( __EXCEPTIONS) && defined(__GNUC__) && (__GNUC__ == 9) && ((__GNUC_MINOR__ == 3) || (__GNUC_MINOR__ == 4))
    CHECK(output[i] == input[i]); // GCC 9.3 - exceptions breaks std::iota with newer check.
#else
    CHECK(output[i] == ElemType_(i));
#endif
}